

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O2

void __thiscall
cmsys::Glob::AddFile
          (Glob *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *file)

{
  string local_30;
  
  if ((this->Relative)._M_string_length != 0) {
    SystemTools::RelativePath(&local_30,&this->Relative,file);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_30)
    ;
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(files,file);
  return;
}

Assistant:

void Glob::AddFile(std::vector<std::string>& files, const std::string& file)
{
  if ( !this->Relative.empty() )
    {
    files.push_back(kwsys::SystemTools::RelativePath(this->Relative, file));
    }
  else
    {
    files.push_back(file);
    }
}